

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_item_use_handling.hpp
# Opt level: O0

void PatchImproveItemUseHandling::alter_pre_use_function(ROM *rom,uint32_t pre_use_table_addr)

{
  uint32_t uVar1;
  Code *pCVar2;
  Register local_208;
  Code local_1f8;
  Code local_178;
  allocator<char> local_f9;
  string local_f8;
  uint32_t local_d4;
  undefined1 local_d0 [4];
  uint32_t addr;
  Param local_c0 [4];
  DataRegister local_a0;
  undefined1 local_90 [8];
  Code func_set_a0;
  uint32_t pre_use_table_addr_local;
  ROM *rom_local;
  
  func_set_a0._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = pre_use_table_addr;
  md::Code::Code((Code *)local_90);
  md::DataRegister::DataRegister(&local_a0,'\0');
  addr_<void>((uint32_t)local_c0,0xff1152);
  md::Code::moveb((Code *)local_90,(Param *)&local_a0,local_c0);
  uVar1 = func_set_a0._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  md::AddressRegister::AddressRegister((AddressRegister *)local_d0,'\0');
  md::Code::lea((Code *)local_90,uVar1,(AddressRegister *)local_d0);
  md::Code::rts((Code *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_90,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_178._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_178._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_178._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_178._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._labels._M_t._M_impl._0_8_ = 0;
  local_178._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_178._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_178._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_178._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_178._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._pending_branches._M_t._M_impl._0_8_ = 0;
  local_178._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d4 = uVar1;
  md::Code::Code(&local_178);
  pCVar2 = md::Code::jsr(&local_178,local_d4);
  pCVar2 = md::Code::nop(pCVar2,2);
  md::ROM::set_code(rom,0x85f2,pCVar2);
  md::Code::~Code(&local_178);
  md::ROM::set_byte(rom,0x85ff,'\x06');
  local_1f8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1f8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1f8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1f8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8._labels._M_t._M_impl._0_8_ = 0;
  local_1f8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1f8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_1f8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1f8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1f8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_1f8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_1f8);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_208,'\0');
  pCVar2 = md::Code::addql(&local_1f8,'\b',&local_208);
  md::ROM::set_code(rom,0x860e,pCVar2);
  md::Code::~Code(&local_1f8);
  md::Code::~Code((Code *)local_90);
  return;
}

Assistant:

static void alter_pre_use_function(md::ROM& rom, uint32_t pre_use_table_addr)
    {
        md::Code func_set_a0;
        {
            func_set_a0.moveb(reg_D0, addr_(0xFF1152));
            func_set_a0.lea(pre_use_table_addr, reg_A0);
        }
        func_set_a0.rts();
        uint32_t addr = rom.inject_code(func_set_a0);

        rom.set_code(0x85F2, md::Code().jsr(addr).nop(2));

        rom.set_byte(0x85FF, 0x06); // Jump instructions are now 6 bytes long instead of 4 bytes long
        rom.set_code(0x860E, md::Code().addql(0x8, reg_A0)); // A block is now 8 bytes long instead of 6
    }